

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

int yaml_parser_parse(yaml_parser_t *parser,yaml_event_t *event)

{
  size_t sVar1;
  yaml_tag_directive_t *pyVar2;
  yaml_parser_state_t *pyVar3;
  size_t sVar4;
  size_t sVar5;
  yaml_token_t *pyVar6;
  yaml_char_t *pyVar7;
  yaml_encoding_t yVar8;
  int iVar9;
  int iVar10;
  yaml_mark_t start_mark;
  size_t local_58;
  size_t sStack_50;
  size_t local_48;
  size_t local_38;
  size_t sStack_30;
  size_t local_28;
  
  if (parser == (yaml_parser_t *)0x0) {
    __assert_fail("parser",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/parser.c"
                  ,0xac,"int yaml_parser_parse(yaml_parser_t *, yaml_event_t *)");
  }
  if (event == (yaml_event_t *)0x0) {
    __assert_fail("event",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/parser.c"
                  ,0xad,"int yaml_parser_parse(yaml_parser_t *, yaml_event_t *)");
  }
  (event->end_mark).index = 0;
  (event->end_mark).line = 0;
  (event->start_mark).line = 0;
  (event->start_mark).column = 0;
  *(undefined8 *)((long)&event->data + 0x28) = 0;
  (event->start_mark).index = 0;
  (event->data).scalar.length = 0;
  *(undefined8 *)((long)&event->data + 0x20) = 0;
  (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
  (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
  *(undefined8 *)event = 0;
  (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
  (event->end_mark).column = 0;
  iVar10 = 1;
  if (parser->stream_end_produced != 0) {
    return 1;
  }
  if (parser->error != YAML_NO_ERROR) {
    return 1;
  }
  switch(parser->state) {
  case YAML_PARSE_STREAM_START_STATE:
    if ((parser->token_available == 0) &&
       (iVar10 = yaml_parser_fetch_more_tokens(parser), iVar10 == 0)) {
      pyVar6 = (yaml_token_t *)0x0;
    }
    else {
      pyVar6 = (parser->tokens).head;
    }
    if (pyVar6 != (yaml_token_t *)0x0) {
      if (pyVar6->type != YAML_STREAM_START_TOKEN) {
        sVar1 = (pyVar6->start_mark).column;
        sVar4 = (pyVar6->start_mark).index;
        sVar5 = (pyVar6->start_mark).line;
        parser->error = YAML_PARSER_ERROR;
        parser->problem = "did not find expected <stream-start>";
        (parser->problem_mark).index = sVar4;
        (parser->problem_mark).line = sVar5;
        (parser->problem_mark).column = sVar1;
        return 0;
      }
      parser->state = YAML_PARSE_IMPLICIT_DOCUMENT_START_STATE;
      *(undefined8 *)event = 0;
      (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
      (event->end_mark).index = 0;
      (event->end_mark).line = 0;
      (event->start_mark).line = 0;
      (event->start_mark).column = 0;
      *(undefined8 *)((long)&event->data + 0x28) = 0;
      (event->start_mark).index = 0;
      (event->data).scalar.length = 0;
      *(undefined8 *)((long)&event->data + 0x20) = 0;
      (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
      (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
      (event->end_mark).column = 0;
      event->type = YAML_STREAM_START_EVENT;
      (event->start_mark).column = (pyVar6->start_mark).column;
      sVar1 = (pyVar6->start_mark).line;
      (event->start_mark).index = (pyVar6->start_mark).index;
      (event->start_mark).line = sVar1;
      sVar1 = (pyVar6->start_mark).line;
      (event->end_mark).index = (pyVar6->start_mark).index;
      (event->end_mark).line = sVar1;
      (event->end_mark).column = (pyVar6->start_mark).column;
      (event->data).stream_start.encoding = (pyVar6->data).stream_start.encoding;
      parser->token_available = 0;
      parser->tokens_parsed = parser->tokens_parsed + 1;
      pyVar6 = (parser->tokens).head;
      parser->stream_end_produced = (uint)(pyVar6->type == YAML_STREAM_END_TOKEN);
      (parser->tokens).head = pyVar6 + 1;
      return 1;
    }
    return 0;
  case YAML_PARSE_IMPLICIT_DOCUMENT_START_STATE:
    iVar10 = 1;
    goto LAB_001051fa;
  case YAML_PARSE_DOCUMENT_START_STATE:
    iVar10 = 0;
LAB_001051fa:
    iVar10 = yaml_parser_parse_document_start(parser,event,iVar10);
    return iVar10;
  case YAML_PARSE_DOCUMENT_CONTENT_STATE:
    if ((parser->token_available == 0) &&
       (iVar10 = yaml_parser_fetch_more_tokens(parser), iVar10 == 0)) {
      pyVar6 = (yaml_token_t *)0x0;
    }
    else {
      pyVar6 = (parser->tokens).head;
    }
    if (pyVar6 == (yaml_token_t *)0x0) break;
    if (pyVar6->type - YAML_STREAM_END_TOKEN < 5) {
      pyVar3 = (parser->states).top;
      (parser->states).top = pyVar3 + -1;
      parser->state = pyVar3[-1];
      goto LAB_00105811;
    }
  case YAML_PARSE_BLOCK_NODE_STATE:
    iVar10 = 1;
LAB_001058f9:
    iVar9 = 0;
LAB_001058fb:
    iVar10 = yaml_parser_parse_node(parser,event,iVar10,iVar9);
    return iVar10;
  case YAML_PARSE_DOCUMENT_END_STATE:
    if ((parser->token_available == 0) &&
       (iVar10 = yaml_parser_fetch_more_tokens(parser), iVar10 == 0)) {
      pyVar6 = (yaml_token_t *)0x0;
    }
    else {
      pyVar6 = (parser->tokens).head;
    }
    if (pyVar6 != (yaml_token_t *)0x0) {
      local_28 = (pyVar6->start_mark).column;
      local_38 = (pyVar6->start_mark).index;
      sStack_30 = (pyVar6->start_mark).line;
      sVar1 = (pyVar6->start_mark).column;
      sVar4 = (pyVar6->start_mark).index;
      sVar5 = (pyVar6->start_mark).line;
      yVar8 = YAML_UTF8_ENCODING;
      if (pyVar6->type == YAML_DOCUMENT_END_TOKEN) {
        local_28 = (pyVar6->end_mark).column;
        local_38 = (pyVar6->end_mark).index;
        sStack_30 = (pyVar6->end_mark).line;
        parser->token_available = 0;
        parser->tokens_parsed = parser->tokens_parsed + 1;
        pyVar6 = (parser->tokens).head;
        parser->stream_end_produced = (uint)(pyVar6->type == YAML_STREAM_END_TOKEN);
        (parser->tokens).head = pyVar6 + 1;
        yVar8 = YAML_ANY_ENCODING;
      }
      while (pyVar2 = (parser->tag_directives).top, (parser->tag_directives).start != pyVar2) {
        (parser->tag_directives).top = pyVar2 + -1;
        pyVar7 = pyVar2[-1].prefix;
        yaml_free(pyVar2[-1].handle);
        yaml_free(pyVar7);
      }
      parser->state = YAML_PARSE_DOCUMENT_START_STATE;
      *(undefined8 *)event = 0;
      (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
      (event->end_mark).index = 0;
      (event->end_mark).line = 0;
      (event->start_mark).line = 0;
      (event->start_mark).column = 0;
      *(undefined8 *)((long)&event->data + 0x28) = 0;
      (event->start_mark).index = 0;
      (event->data).scalar.length = 0;
      *(undefined8 *)((long)&event->data + 0x20) = 0;
      (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
      (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
      (event->end_mark).column = 0;
      event->type = YAML_DOCUMENT_END_EVENT;
      (event->start_mark).index = sVar4;
      (event->start_mark).line = sVar5;
      (event->start_mark).column = sVar1;
      (event->end_mark).index = local_38;
      (event->end_mark).line = sStack_30;
      (event->end_mark).column = local_28;
      (event->data).stream_start.encoding = yVar8;
      return 1;
    }
    break;
  case YAML_PARSE_BLOCK_NODE_OR_INDENTLESS_SEQUENCE_STATE:
    iVar10 = 1;
    iVar9 = 1;
    goto LAB_001058fb;
  case YAML_PARSE_FLOW_NODE_STATE:
    goto switchD_00104fae_caseD_7;
  case YAML_PARSE_BLOCK_SEQUENCE_FIRST_ENTRY_STATE:
    iVar10 = 1;
    goto LAB_00105513;
  case YAML_PARSE_BLOCK_SEQUENCE_ENTRY_STATE:
    iVar10 = 0;
LAB_00105513:
    iVar10 = yaml_parser_parse_block_sequence_entry(parser,event,iVar10);
    return iVar10;
  case YAML_PARSE_INDENTLESS_SEQUENCE_ENTRY_STATE:
    if ((parser->token_available == 0) &&
       (iVar10 = yaml_parser_fetch_more_tokens(parser), iVar10 == 0)) {
      pyVar6 = (yaml_token_t *)0x0;
    }
    else {
      pyVar6 = (parser->tokens).head;
    }
    if (pyVar6 != (yaml_token_t *)0x0) {
      if (pyVar6->type != YAML_BLOCK_ENTRY_TOKEN) {
        pyVar3 = (parser->states).top;
        (parser->states).top = pyVar3 + -1;
        parser->state = pyVar3[-1];
        *(undefined8 *)event = 0;
        (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
        (event->end_mark).index = 0;
        (event->end_mark).line = 0;
        (event->start_mark).line = 0;
        (event->start_mark).column = 0;
        *(undefined8 *)((long)&event->data + 0x28) = 0;
        (event->start_mark).index = 0;
        (event->data).scalar.length = 0;
        *(undefined8 *)((long)&event->data + 0x20) = 0;
        (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
        (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
        (event->end_mark).column = 0;
        event->type = YAML_SEQUENCE_END_EVENT;
        sVar1 = (pyVar6->start_mark).line;
        (event->start_mark).index = (pyVar6->start_mark).index;
        (event->start_mark).line = sVar1;
        (event->start_mark).column = (pyVar6->start_mark).column;
        sVar1 = (pyVar6->start_mark).line;
        (event->end_mark).index = (pyVar6->start_mark).index;
        (event->end_mark).line = sVar1;
        (event->end_mark).column = (pyVar6->start_mark).column;
        return 1;
      }
      local_48 = (pyVar6->end_mark).column;
      local_58 = (pyVar6->end_mark).index;
      sStack_50 = (pyVar6->end_mark).line;
      parser->token_available = 0;
      parser->tokens_parsed = parser->tokens_parsed + 1;
      pyVar6 = (parser->tokens).head;
      parser->stream_end_produced = (uint)(pyVar6->type == YAML_STREAM_END_TOKEN);
      (parser->tokens).head = pyVar6 + 1;
      iVar10 = yaml_parser_fetch_more_tokens(parser);
      iVar9 = 0;
      if (iVar10 == 0) {
        pyVar6 = (yaml_token_t *)0x0;
      }
      else {
        pyVar6 = (parser->tokens).head;
      }
      if (pyVar6 == (yaml_token_t *)0x0) {
        return 0;
      }
      if ((YAML_VALUE_TOKEN < pyVar6->type) ||
         ((0x34200U >> (pyVar6->type & (YAML_KEY_TOKEN|YAML_FLOW_ENTRY_TOKEN)) & 1) == 0)) {
        if (((parser->states).top != (parser->states).end) ||
           (iVar10 = yaml_stack_extend(&(parser->states).start,&(parser->states).top,
                                       &(parser->states).end), iVar10 != 0)) {
          pyVar3 = (parser->states).top;
          (parser->states).top = pyVar3 + 1;
          *pyVar3 = YAML_PARSE_INDENTLESS_SEQUENCE_ENTRY_STATE;
          iVar10 = 0;
LAB_001059bd:
          iVar10 = yaml_parser_parse_node(parser,event,1,iVar10);
          return iVar10;
        }
        goto LAB_0010589f;
      }
      parser->state = YAML_PARSE_INDENTLESS_SEQUENCE_ENTRY_STATE;
LAB_00105769:
      iVar9 = 0;
      pyVar7 = (yaml_char_t *)yaml_malloc(1);
      if (pyVar7 != (yaml_char_t *)0x0) {
        *pyVar7 = '\0';
        *(undefined8 *)event = 0;
        (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
        (event->end_mark).column = 0;
        (event->end_mark).index = 0;
        (event->end_mark).line = 0;
        (event->start_mark).line = 0;
        (event->start_mark).column = 0;
        *(undefined8 *)((long)&event->data + 0x28) = 0;
        (event->start_mark).index = 0;
        (event->data).scalar.length = 0;
        *(undefined8 *)((long)&event->data + 0x20) = 0;
        (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
        (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
        event->type = YAML_SCALAR_EVENT;
        (event->start_mark).index = local_58;
        (event->start_mark).line = sStack_50;
        (event->start_mark).column = local_48;
        (event->end_mark).index = local_58;
        (event->end_mark).line = sStack_50;
        (event->end_mark).column = local_48;
        (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
        (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
        (event->data).scalar.value = pyVar7;
        (event->data).scalar.length = 0;
        *(undefined8 *)((long)&event->data + 0x20) = 1;
        (event->data).scalar.style = YAML_PLAIN_SCALAR_STYLE;
        return 1;
      }
      goto LAB_0010589f;
    }
    break;
  case YAML_PARSE_BLOCK_MAPPING_FIRST_KEY_STATE:
    iVar10 = 1;
    goto LAB_00105349;
  case YAML_PARSE_BLOCK_MAPPING_KEY_STATE:
    iVar10 = 0;
LAB_00105349:
    iVar10 = yaml_parser_parse_block_mapping_key(parser,event,iVar10);
    return iVar10;
  case YAML_PARSE_BLOCK_MAPPING_VALUE_STATE:
    if ((parser->token_available == 0) &&
       (iVar10 = yaml_parser_fetch_more_tokens(parser), iVar10 == 0)) {
      pyVar6 = (yaml_token_t *)0x0;
    }
    else {
      pyVar6 = (parser->tokens).head;
    }
    if (pyVar6 != (yaml_token_t *)0x0) {
      if (pyVar6->type != YAML_VALUE_TOKEN) {
        parser->state = YAML_PARSE_BLOCK_MAPPING_KEY_STATE;
        goto LAB_00105811;
      }
      local_48 = (pyVar6->end_mark).column;
      local_58 = (pyVar6->end_mark).index;
      sStack_50 = (pyVar6->end_mark).line;
      parser->token_available = 0;
      parser->tokens_parsed = parser->tokens_parsed + 1;
      pyVar6 = (parser->tokens).head;
      parser->stream_end_produced = (uint)(pyVar6->type == YAML_STREAM_END_TOKEN);
      (parser->tokens).head = pyVar6 + 1;
      iVar10 = yaml_parser_fetch_more_tokens(parser);
      iVar9 = 0;
      if (iVar10 == 0) {
        pyVar6 = (yaml_token_t *)0x0;
      }
      else {
        pyVar6 = (parser->tokens).head;
      }
      if (pyVar6 == (yaml_token_t *)0x0) {
        return 0;
      }
      if ((YAML_VALUE_TOKEN < pyVar6->type) ||
         ((0x30200U >> (pyVar6->type & (YAML_KEY_TOKEN|YAML_FLOW_ENTRY_TOKEN)) & 1) == 0)) {
        if (((parser->states).top != (parser->states).end) ||
           (iVar10 = yaml_stack_extend(&(parser->states).start,&(parser->states).top,
                                       &(parser->states).end), iVar10 != 0)) {
          pyVar3 = (parser->states).top;
          (parser->states).top = pyVar3 + 1;
          *pyVar3 = YAML_PARSE_BLOCK_MAPPING_KEY_STATE;
          iVar10 = 1;
          goto LAB_001059bd;
        }
        goto LAB_0010589f;
      }
      parser->state = YAML_PARSE_BLOCK_MAPPING_KEY_STATE;
      goto LAB_00105769;
    }
    break;
  case YAML_PARSE_FLOW_SEQUENCE_FIRST_ENTRY_STATE:
    iVar10 = 1;
    goto LAB_001051e3;
  case YAML_PARSE_FLOW_SEQUENCE_ENTRY_STATE:
    iVar10 = 0;
LAB_001051e3:
    iVar10 = yaml_parser_parse_flow_sequence_entry(parser,event,iVar10);
    return iVar10;
  case YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_KEY_STATE:
    if ((parser->token_available == 0) &&
       (iVar10 = yaml_parser_fetch_more_tokens(parser), iVar10 == 0)) {
      pyVar6 = (yaml_token_t *)0x0;
    }
    else {
      pyVar6 = (parser->tokens).head;
    }
    iVar9 = 0;
    if (pyVar6 == (yaml_token_t *)0x0) {
      return 0;
    }
    if ((pyVar6->type < YAML_ALIAS_TOKEN) &&
       ((0x28800U >> (pyVar6->type & (YAML_KEY_TOKEN|YAML_FLOW_ENTRY_TOKEN)) & 1) != 0)) {
      local_48 = (pyVar6->end_mark).column;
      local_58 = (pyVar6->end_mark).index;
      sStack_50 = (pyVar6->end_mark).line;
      parser->token_available = 0;
      parser->tokens_parsed = parser->tokens_parsed + 1;
      pyVar6 = (parser->tokens).head;
      parser->stream_end_produced = (uint)(pyVar6->type == YAML_STREAM_END_TOKEN);
      (parser->tokens).head = pyVar6 + 1;
      parser->state = YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_VALUE_STATE;
LAB_00105822:
      pyVar7 = (yaml_char_t *)yaml_malloc(1);
      if (pyVar7 == (yaml_char_t *)0x0) {
        iVar9 = 0;
      }
      else {
        *pyVar7 = '\0';
        *(undefined8 *)event = 0;
        (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
        (event->end_mark).column = 0;
        (event->end_mark).index = 0;
        (event->end_mark).line = 0;
        (event->start_mark).line = 0;
        (event->start_mark).column = 0;
        *(undefined8 *)((long)&event->data + 0x28) = 0;
        (event->start_mark).index = 0;
        (event->data).scalar.length = 0;
        *(undefined8 *)((long)&event->data + 0x20) = 0;
        (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
        (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
        parser = (yaml_parser_t *)&(event->data).scalar.style;
        event->type = YAML_SCALAR_EVENT;
        (event->start_mark).index = local_58;
        (event->start_mark).line = sStack_50;
        (event->start_mark).column = local_48;
        (event->end_mark).index = local_58;
        (event->end_mark).line = sStack_50;
        (event->end_mark).column = local_48;
        (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
        (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
        (event->data).scalar.value = pyVar7;
        (event->data).scalar.length = 0;
        *(undefined8 *)((long)&event->data + 0x20) = 1;
        iVar9 = 1;
      }
LAB_0010589f:
      parser->error = YAML_PLAIN_SCALAR_STYLE;
      return iVar9;
    }
    if (((parser->states).top == (parser->states).end) &&
       (iVar10 = yaml_stack_extend(&(parser->states).start,&(parser->states).top,
                                   &(parser->states).end), iVar10 == 0)) goto LAB_0010589f;
    pyVar3 = (parser->states).top;
    (parser->states).top = pyVar3 + 1;
    *pyVar3 = YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_VALUE_STATE;
    goto switchD_00104fae_caseD_7;
  case YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_VALUE_STATE:
    if ((parser->token_available == 0) &&
       (iVar10 = yaml_parser_fetch_more_tokens(parser), iVar10 == 0)) {
      pyVar6 = (yaml_token_t *)0x0;
    }
    else {
      pyVar6 = (parser->tokens).head;
    }
    if (pyVar6 != (yaml_token_t *)0x0) {
      if (pyVar6->type == YAML_VALUE_TOKEN) {
        parser->token_available = 0;
        parser->tokens_parsed = parser->tokens_parsed + 1;
        pyVar6 = (parser->tokens).head;
        parser->stream_end_produced = (uint)(pyVar6->type == YAML_STREAM_END_TOKEN);
        (parser->tokens).head = pyVar6 + 1;
        iVar10 = yaml_parser_fetch_more_tokens(parser);
        iVar9 = 0;
        if (iVar10 == 0) {
          pyVar6 = (yaml_token_t *)0x0;
        }
        else {
          pyVar6 = (parser->tokens).head;
        }
        if (pyVar6 == (yaml_token_t *)0x0) {
          return 0;
        }
        if ((pyVar6->type | YAML_TAG_DIRECTIVE_TOKEN) != YAML_FLOW_ENTRY_TOKEN) {
          if (((parser->states).top == (parser->states).end) &&
             (iVar10 = yaml_stack_extend(&(parser->states).start,&(parser->states).top,
                                         &(parser->states).end), iVar10 == 0)) goto LAB_0010589f;
          pyVar3 = (parser->states).top;
          (parser->states).top = pyVar3 + 1;
          *pyVar3 = YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_END_STATE;
          goto switchD_00104fae_caseD_7;
        }
      }
      parser->state = YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_END_STATE;
LAB_00105811:
      local_48 = (pyVar6->start_mark).column;
      local_58 = (pyVar6->start_mark).index;
      sStack_50 = (pyVar6->start_mark).line;
      goto LAB_00105822;
    }
    break;
  case YAML_PARSE_FLOW_SEQUENCE_ENTRY_MAPPING_END_STATE:
    if ((parser->token_available == 0) &&
       (iVar10 = yaml_parser_fetch_more_tokens(parser), iVar10 == 0)) {
      pyVar6 = (yaml_token_t *)0x0;
    }
    else {
      pyVar6 = (parser->tokens).head;
    }
    if (pyVar6 != (yaml_token_t *)0x0) {
      parser->state = YAML_PARSE_FLOW_SEQUENCE_ENTRY_STATE;
      *(undefined8 *)event = 0;
      (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
      (event->end_mark).index = 0;
      (event->end_mark).line = 0;
      (event->start_mark).line = 0;
      (event->start_mark).column = 0;
      *(undefined8 *)((long)&event->data + 0x28) = 0;
      (event->start_mark).index = 0;
      (event->data).scalar.length = 0;
      *(undefined8 *)((long)&event->data + 0x20) = 0;
      (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
      (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
      (event->end_mark).column = 0;
      event->type = YAML_MAPPING_END_EVENT;
      sVar1 = (pyVar6->start_mark).line;
      (event->start_mark).index = (pyVar6->start_mark).index;
      (event->start_mark).line = sVar1;
      (event->start_mark).column = (pyVar6->start_mark).column;
      sVar1 = (pyVar6->start_mark).line;
      (event->end_mark).index = (pyVar6->start_mark).index;
      (event->end_mark).line = sVar1;
      (event->end_mark).column = (pyVar6->start_mark).column;
      return 1;
    }
    break;
  case YAML_PARSE_FLOW_MAPPING_FIRST_KEY_STATE:
    iVar10 = 1;
    goto LAB_00105332;
  case YAML_PARSE_FLOW_MAPPING_KEY_STATE:
    iVar10 = 0;
LAB_00105332:
    iVar10 = yaml_parser_parse_flow_mapping_key(parser,event,iVar10);
    return iVar10;
  case YAML_PARSE_FLOW_MAPPING_VALUE_STATE:
    iVar10 = 0;
    goto LAB_001055c0;
  case YAML_PARSE_FLOW_MAPPING_EMPTY_VALUE_STATE:
    iVar10 = 1;
LAB_001055c0:
    iVar10 = yaml_parser_parse_flow_mapping_value(parser,event,iVar10);
    return iVar10;
  case YAML_PARSE_END_STATE:
    goto switchD_00104fae_caseD_17;
  }
  iVar10 = 0;
switchD_00104fae_caseD_17:
  return iVar10;
switchD_00104fae_caseD_7:
  iVar10 = 0;
  goto LAB_001058f9;
}

Assistant:

YAML_DECLARE(int)
yaml_parser_parse(yaml_parser_t *parser, yaml_event_t *event)
{
    assert(parser);     /* Non-NULL parser object is expected. */
    assert(event);      /* Non-NULL event object is expected. */

    /* Erase the event object. */

    memset(event, 0, sizeof(yaml_event_t));

    /* No events after the end of the stream or error. */

    if (parser->stream_end_produced || parser->error ||
            parser->state == YAML_PARSE_END_STATE) {
        return 1;
    }

    /* Generate the next event. */

    return yaml_parser_state_machine(parser, event);
}